

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

string * __thiscall
pbrt::PiecewiseLinearSpectrum::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PiecewiseLinearSpectrum *this)

{
  SpectrumHandle *in_RDX;
  long lVar1;
  ulong uVar2;
  string ret_1;
  string ret;
  string name;
  string local_a0;
  long *local_80;
  long local_78;
  long local_70 [2];
  string *local_60;
  string local_58;
  ulong local_38;
  
  local_38 = (ulong)this | 0x3000000000000;
  FindMatchingNamedSpectrum_abi_cxx11_(&local_58,(pbrt *)&local_38,in_RDX);
  if (local_58._M_string_length == 0) {
    local_80 = local_70;
    local_60 = __return_storage_ptr__;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"[ PiecewiseLinearSpectrum ","");
    if ((this->lambdas).nStored != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        local_a0._M_string_length = 0;
        local_a0.field_2._M_local_buf[0] = '\0';
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        detail::stringPrintfRecursive<float_const&,float_const&>
                  (&local_a0,"%f %f ",(float *)((long)(this->lambdas).ptr + lVar1),
                   (float *)((long)(this->values).ptr + lVar1));
        std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,
                          CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                   local_a0.field_2._M_local_buf[0]) + 1);
        }
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 4;
      } while (uVar2 < (this->lambdas).nStored);
    }
    __return_storage_ptr__ = local_60;
    (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
    std::__cxx11::string::_M_construct<char*>((string *)local_60,local_80,local_78 + (long)local_80)
    ;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<std::__cxx11::string&>(__return_storage_ptr__,"\"%s\"",&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PiecewiseLinearSpectrum::ToString() const {
    std::string name = FindMatchingNamedSpectrum(this);
    if (!name.empty())
        return StringPrintf("\"%s\"", name);

    std::string ret = "[ PiecewiseLinearSpectrum ";
    for (size_t i = 0; i < lambdas.size(); ++i)
        ret += StringPrintf("%f %f ", lambdas[i], values[i]);
    return ret + " ]";
}